

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

char * nrv_alloc(char *s,char *s0,size_t s0len,char **rve,int n)

{
  char cVar1;
  char *local_40;
  char *t;
  char *rv;
  int n_local;
  char **rve_local;
  size_t s0len_local;
  char *s0_local;
  char *s_local;
  
  if (s0 == (char *)0x0) {
    s0len_local = (size_t)rv_alloc(n);
  }
  else {
    s0len_local = (size_t)s0;
    if (s0len <= (ulong)(long)n) {
      t = (char *)0x0;
      local_40 = (char *)(long)n;
      goto LAB_0010a610;
    }
  }
  t = (char *)s0len_local;
  local_40 = (char *)s0len_local;
  s0_local = s;
  while( true ) {
    cVar1 = *s0_local;
    *local_40 = cVar1;
    if (cVar1 == '\0') break;
    local_40 = local_40 + 1;
    s0_local = s0_local + 1;
  }
LAB_0010a610:
  if (rve != (char **)0x0) {
    *rve = local_40;
  }
  return t;
}

Assistant:

static char *
nrv_alloc(const char *s, char *s0, size_t s0len, char **rve, int n MTd)
{
	char *rv, *t;

	if (!s0)
		s0 = rv_alloc(n MTa);
	else if (s0len <= n) {
		rv = 0;
		t = rv + n;
		goto rve_chk;
		}
	t = rv = s0;
	while((*t = *s++))
		++t;
 rve_chk:
	if (rve)
		*rve = t;
	return rv;
	}